

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::IsSubSymbolOf
          (SymbolEntry *this,DescriptorIndex *index,string_view super_symbol)

{
  bool bVar1;
  string_view part;
  undefined1 local_48 [8];
  string_view p;
  anon_class_8_1_afd010da consume_part;
  DescriptorIndex *index_local;
  SymbolEntry *this_local;
  string_view super_symbol_local;
  
  super_symbol_local._M_len = (size_t)super_symbol._M_str;
  this_local = (SymbolEntry *)super_symbol._M_len;
  p._M_str = (char *)&this_local;
  _local_48 = package(this,index);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  if ((bVar1) ||
     (bVar1 = IsSubSymbolOf::anon_class_8_1_afd010da::operator()
                        ((anon_class_8_1_afd010da *)&p._M_str,_local_48), bVar1)) {
    part = symbol(this,index);
    super_symbol_local._M_str._7_1_ =
         IsSubSymbolOf::anon_class_8_1_afd010da::operator()
                   ((anon_class_8_1_afd010da *)&p._M_str,part);
  }
  else {
    super_symbol_local._M_str._7_1_ = false;
  }
  return super_symbol_local._M_str._7_1_;
}

Assistant:

bool IsSubSymbolOf(const DescriptorIndex& index,
                       absl::string_view super_symbol) const {
      const auto consume_part = [&](absl::string_view part) {
        if (!absl::ConsumePrefix(&super_symbol, part)) return false;
        return super_symbol.empty() || absl::ConsumePrefix(&super_symbol, ".");
      };
      if (auto p = package(index); !p.empty()) {
        if (!consume_part(p)) return false;
      }
      return consume_part(symbol(index));
    }